

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O1

void Cmd_quickload(FCommandLine *argv,APlayerPawn *who,int key)

{
  undefined8 in_RAX;
  char *message;
  DMenu *menu;
  undefined8 local_18;
  
  local_18 = in_RAX;
  if (netgame) {
    M_StartControlPanel(true);
    message = FStringTable::operator()(&GStrings,"QLOADNET");
    local_18 = (ulong)(uint)local_18._0_4_;
    M_StartMessage(message,1,(FName *)((long)&local_18 + 4));
  }
  else {
    if (quickSaveSlot != (FSaveGameNode *)0x0) {
      if (saveloadconfirmation.Value) {
        M_StartControlPanel(true);
        menu = (DMenu *)M_Malloc_Dbg(0x50,
                                     "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                                     ,0x1f7);
        DQuickLoadMenu::DQuickLoadMenu((DQuickLoadMenu *)menu,false);
        (menu->mParentMenu).field_0.p = DMenu::CurrentMenu;
        M_ActivateMenu(menu);
        return;
      }
      G_LoadGame((quickSaveSlot->Filename).Chars,false);
      return;
    }
    M_StartControlPanel(true);
    quickSaveSlot = (FSaveGameNode *)0x1;
    local_18 = CONCAT44(local_18._4_4_,0x1dd);
    M_SetMenu((FName *)&local_18,-1);
  }
  return;
}

Assistant:

CCMD (quickload)
{	// F9
	if (netgame)
	{
		M_StartControlPanel(true);
		M_StartMessage (GStrings("QLOADNET"), 1);
		return;
	}
		
	if (quickSaveSlot == NULL)
	{
		M_StartControlPanel(true);
		// signal that whatever gets loaded should be the new quicksave
		quickSaveSlot = (FSaveGameNode *)1;
		M_SetMenu(NAME_Loadgamemenu);
		return;
	}

	// [mxd]. Just load the game, no questions asked.
	if (!saveloadconfirmation)
	{
		G_LoadGame(quickSaveSlot->Filename.GetChars());
		return;
	}

	M_StartControlPanel(true);
	DMenu *newmenu = new DQuickLoadMenu(false);
	newmenu->mParentMenu = DMenu::CurrentMenu;
	M_ActivateMenu(newmenu);
}